

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void * fio_malloc(size_t size)

{
  fio_lock_i fVar1;
  void *pvVar2;
  arena_s *paVar3;
  block_s *blk;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  block_s *pbVar7;
  long lVar8;
  ushort uVar9;
  long lVar10;
  undefined8 *puVar11;
  long in_FS_OFFSET;
  bool bVar12;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  if (size == 0) {
    return &on_malloc_zero;
  }
  if (0x3fff < size) {
    pvVar2 = big_alloc(size);
    return pvVar2;
  }
  lVar10 = ((size >> 4) + 1) - (ulong)((size & 0xf) == 0);
  paVar3 = *(arena_s **)(in_FS_OFFSET + -0x2b0);
  if (*(arena_s **)(in_FS_OFFSET + -0x2b0) == (arena_s *)0x0) {
    paVar3 = arenas;
  }
  LOCK();
  fVar1 = paVar3->lock;
  paVar3->lock = '\x01';
  UNLOCK();
  uVar5 = memory.cores;
  if (fVar1 != '\0') {
    do {
      lVar8 = 0;
      for (uVar6 = (long)paVar3 - (long)arenas >> 4; uVar6 < uVar5; uVar6 = uVar6 + 1) {
        if (paVar3 == arenas || lVar8 != 0) {
          LOCK();
          fVar1 = (&paVar3->lock)[lVar8];
          (&paVar3->lock)[lVar8] = '\x01';
          UNLOCK();
          uVar5 = memory.cores;
          if (fVar1 == '\0') {
            paVar3 = (arena_s *)((long)&paVar3->block + lVar8);
            goto LAB_001293ab;
          }
        }
        lVar8 = lVar8 + 0x10;
      }
      bVar12 = paVar3 == arenas;
      paVar3 = arenas;
      if (bVar12) {
        fio_reschedule_thread();
        paVar3 = arenas;
        uVar5 = memory.cores;
      }
    } while( true );
  }
LAB_001293ab:
  *(arena_s **)(in_FS_OFFSET + -0x2b0) = paVar3;
  blk = paVar3->block;
  if (blk == (block_s *)0x0) {
LAB_001293d5:
    blk = block_new();
    puVar11 = *(undefined8 **)(in_FS_OFFSET + -0x2b0);
    *puVar11 = blk;
    if (blk == (block_s *)0x0) {
      piVar4 = __errno_location();
      *piVar4 = 0xc;
      pbVar7 = (block_s *)0x0;
      goto LAB_0012943b;
    }
    uVar9 = blk->pos;
  }
  else {
    uVar9 = blk->pos;
    if (0x7fe < lVar10 + (ulong)uVar9) {
      block_free(blk);
      goto LAB_001293d5;
    }
  }
  pbVar7 = blk + uVar9;
  LOCK();
  blk->ref = blk->ref + 1;
  UNLOCK();
  uVar9 = (short)lVar10 + blk->pos;
  blk->pos = uVar9;
  if (uVar9 < 0x7fe) {
    puVar11 = *(undefined8 **)(in_FS_OFFSET + -0x2b0);
  }
  else {
    block_free(blk);
    puVar11 = *(undefined8 **)(in_FS_OFFSET + -0x2b0);
    *puVar11 = 0;
  }
LAB_0012943b:
  LOCK();
  *(undefined1 *)(puVar11 + 1) = 0;
  UNLOCK();
  return pbVar7;
}

Assistant:

void *fio_malloc(size_t size) {
#if FIO_OVERRIDE_MALLOC
  if (!arenas)
    fio_mem_init();
#endif
  if (!size) {
    /* changed behavior prevents "allocation failed" test for `malloc(0)` */
    return (void *)(&on_malloc_zero);
  }
  if (size >= FIO_MEMORY_BLOCK_ALLOC_LIMIT) {
    /* system allocation - must be block aligned */
    // FIO_LOG_WARNING("fio_malloc re-routed to mmap - big allocation");
    return big_alloc(size);
  }
  /* ceiling for 16 byte alignement, translated to 16 byte units */
  size = (size >> 4) + (!!(size & 15));
  arena_enter();
  void *mem = block_slice(size);
  arena_exit();
  return mem;
}